

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O0

void mod2sparse_clear(mod2sparse *r)

{
  undefined8 *__ptr;
  long lVar1;
  int *in_RDI;
  int j;
  int i;
  mod2entry *e;
  mod2block *b;
  int local_20;
  int local_1c;
  
  for (local_1c = 0; local_1c < *in_RDI; local_1c = local_1c + 1) {
    lVar1 = *(long *)(in_RDI + 2) + (long)local_1c * 0x38;
    *(long *)(lVar1 + 0x20) = lVar1;
    *(long *)(lVar1 + 0x18) = lVar1;
    *(long *)(lVar1 + 0x10) = lVar1;
    *(long *)(lVar1 + 8) = lVar1;
  }
  for (local_20 = 0; local_20 < in_RDI[1]; local_20 = local_20 + 1) {
    lVar1 = *(long *)(in_RDI + 4) + (long)local_20 * 0x38;
    *(long *)(lVar1 + 0x20) = lVar1;
    *(long *)(lVar1 + 0x18) = lVar1;
    *(long *)(lVar1 + 0x10) = lVar1;
    *(long *)(lVar1 + 8) = lVar1;
  }
  while (*(long *)(in_RDI + 6) != 0) {
    __ptr = *(undefined8 **)(in_RDI + 6);
    *(undefined8 *)(in_RDI + 6) = *__ptr;
    free(__ptr);
  }
  return;
}

Assistant:

void mod2sparse_clear
( mod2sparse *r
)
{
  mod2block *b;
  mod2entry *e;
  int i, j;

  for (i = 0; i<mod2sparse_rows(r); i++)
  { e = &r->rows[i];
    e->left = e->right = e->up = e->down = e;
  }

  for (j = 0; j<mod2sparse_cols(r); j++)
  { e = &r->cols[j];
    e->left = e->right = e->up = e->down = e;
  }

  while (r->blocks!=0)
  { b = r->blocks;
    r->blocks = b->next;
    free(b);
  }
}